

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::Log::forward_impl
          (Log *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  float *pfVar1;
  Tensor *pTVar2;
  float *pfVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  Index size;
  ulong uVar11;
  ulong uVar12;
  Index index_1;
  ulong uVar13;
  Index index;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float cst_min_norm_pos [4];
  float fVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar10;
  
  pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar10 = (ulong)(pTVar2->d).nd;
  iVar8 = 1;
  iVar7 = 1;
  if (uVar10 != 0) {
    uVar12 = 0;
    do {
      iVar7 = iVar7 * (pTVar2->d).d[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  uVar10 = (ulong)(fx->d).nd;
  if (uVar10 != 0) {
    iVar8 = 1;
    uVar12 = 0;
    do {
      iVar8 = iVar8 * (fx->d).d[uVar12];
      uVar12 = uVar12 + 1;
    } while (uVar10 != uVar12);
  }
  uVar9 = iVar8 * (fx->d).bd;
  uVar10 = (ulong)uVar9;
  if (uVar9 == iVar7 * (pTVar2->d).bd) {
    pfVar3 = fx->v;
    uVar12 = uVar10;
    if ((((ulong)pfVar3 & 3) == 0) &&
       (uVar12 = (ulong)(-((uint)((ulong)pfVar3 >> 2) & 0x3fffffff) & 3), uVar10 <= uVar12)) {
      uVar12 = uVar10;
    }
    pfVar4 = pTVar2->v;
    uVar6 = uVar10 - uVar12;
    uVar13 = uVar6 + 3;
    if (-1 < (long)uVar6) {
      uVar13 = uVar6;
    }
    if (uVar12 != 0) {
      uVar11 = 0;
      do {
        fVar17 = logf(pfVar4[uVar11]);
        pfVar3[uVar11] = fVar17;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    auVar5 = _DAT_0021fb10;
    uVar13 = (uVar13 & 0xfffffffffffffffc) + uVar12;
    if (3 < (long)uVar6) {
      fVar17 = (float)DAT_0021fb10;
      fVar18 = DAT_0021fb10._4_4_;
      fVar19 = DAT_0021fb10._8_4_;
      fVar20 = DAT_0021fb10._12_4_;
      do {
        auVar37 = *(undefined1 (*) [16])(pfVar4 + uVar12);
        fVar33 = auVar37._0_4_;
        fVar34 = auVar37._4_4_;
        fVar35 = auVar37._8_4_;
        fVar36 = auVar37._12_4_;
        auVar37 = maxps(auVar5,auVar37);
        fVar29 = auVar37._0_4_;
        fVar30 = auVar37._4_4_;
        fVar31 = auVar37._8_4_;
        fVar32 = auVar37._12_4_;
        uVar9 = -(uint)(fVar17 <= ABS(fVar29));
        uVar14 = -(uint)(fVar18 <= ABS(fVar30));
        uVar15 = -(uint)(fVar19 <= ABS(fVar31));
        uVar16 = -(uint)(fVar20 <= ABS(fVar32));
        uVar46 = (uint)fVar29 & uVar9 | ~uVar9 & (uint)(fVar29 * 16777216.0);
        uVar47 = (uint)fVar30 & uVar14 | ~uVar14 & (uint)(fVar30 * 16777216.0);
        uVar48 = (uint)fVar31 & uVar15 | ~uVar15 & (uint)(fVar31 * 16777216.0);
        uVar49 = (uint)fVar32 & uVar16 | ~uVar16 & (uint)(fVar32 * 16777216.0);
        uVar21 = uVar46 >> 0x17 & 0xff;
        uVar23 = uVar47 >> 0x17 & 0xff;
        uVar25 = uVar48 >> 0x17 & 0xff;
        uVar27 = uVar49 >> 0x17 & 0xff;
        uVar22 = ~-(uint)(uVar21 == 0xff) & -(uint)(fVar29 != 0.0);
        uVar24 = ~-(uint)(uVar23 == 0xff) & -(uint)(fVar30 != 0.0);
        uVar26 = ~-(uint)(uVar25 == 0xff) & -(uint)(fVar31 != 0.0);
        uVar28 = ~-(uint)(uVar27 == 0xff) & -(uint)(fVar32 != 0.0);
        fVar38 = (float)(~uVar22 & (uint)fVar29 | (uVar46 & 0x807fffff | 0x3f000000) & uVar22);
        fVar40 = (float)(~uVar24 & (uint)fVar30 | (uVar47 & 0x807fffff | 0x3f000000) & uVar24);
        fVar42 = (float)(~uVar26 & (uint)fVar31 | (uVar48 & 0x807fffff | 0x3f000000) & uVar26);
        fVar44 = (float)(~uVar28 & (uint)fVar32 | (uVar49 & 0x807fffff | 0x3f000000) & uVar28);
        fVar39 = fVar38 + -1.0 + (float)(-(uint)(fVar38 < 0.70710677) & (uint)fVar38);
        fVar41 = fVar40 + -1.0 + (float)(-(uint)(fVar40 < 0.70710677) & (uint)fVar40);
        fVar43 = fVar42 + -1.0 + (float)(-(uint)(fVar42 < 0.70710677) & (uint)fVar42);
        fVar45 = fVar44 + -1.0 + (float)(-(uint)(fVar44 < 0.70710677) & (uint)fVar44);
        fVar29 = fVar39 * fVar39 * fVar39;
        fVar30 = fVar41 * fVar41 * fVar41;
        fVar31 = fVar43 * fVar43 * fVar43;
        fVar32 = fVar45 * fVar45 * fVar45;
        pfVar1 = pfVar3 + uVar12;
        *pfVar1 = (float)(~-(uint)(fVar33 != 0.0) & 0xff800000 |
                         (~-(uint)(fVar33 != INFINITY) & 0x7f800000 | -(uint)(fVar33 < 0.0) |
                         (uint)(((float)(uVar22 & (uint)((float)uVar21 +
                                                        (float)(uVar9 & 0xc2fc0000 |
                                                               ~uVar9 & 0xc3160000))) -
                                (float)(-(uint)(fVar38 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar39 * fVar39 * -0.5 +
                               ((((fVar39 * 0.070376836 + -0.1151461) * fVar39 + 0.116769984) *
                                 fVar29 + (fVar39 * -0.12420141 + 0.14249323) * fVar39 + -0.16668057
                                ) * fVar29 +
                               (fVar39 * 0.20000714 + -0.24999994) * fVar39 + 0.3333333) * fVar29 +
                               fVar39) & -(uint)(fVar33 != INFINITY)) & -(uint)(fVar33 != 0.0));
        pfVar1[1] = (float)(~-(uint)(fVar34 != 0.0) & 0xff800000 |
                           (~-(uint)(fVar34 != INFINITY) & 0x7f800000 | -(uint)(fVar34 < 0.0) |
                           (uint)(((float)(uVar24 & (uint)((float)uVar23 +
                                                          (float)(uVar14 & 0xc2fc0000 |
                                                                 ~uVar14 & 0xc3160000))) -
                                  (float)(-(uint)(fVar40 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                                 fVar41 * fVar41 * -0.5 +
                                 ((((fVar41 * 0.070376836 + -0.1151461) * fVar41 + 0.116769984) *
                                   fVar30 + (fVar41 * -0.12420141 + 0.14249323) * fVar41 +
                                            -0.16668057) * fVar30 +
                                 (fVar41 * 0.20000714 + -0.24999994) * fVar41 + 0.3333333) * fVar30
                                 + fVar41) & -(uint)(fVar34 != INFINITY)) & -(uint)(fVar34 != 0.0));
        pfVar1[2] = (float)(~-(uint)(fVar35 != 0.0) & 0xff800000 |
                           (~-(uint)(fVar35 != INFINITY) & 0x7f800000 | -(uint)(fVar35 < 0.0) |
                           (uint)(((float)(uVar26 & (uint)((float)uVar25 +
                                                          (float)(uVar15 & 0xc2fc0000 |
                                                                 ~uVar15 & 0xc3160000))) -
                                  (float)(-(uint)(fVar42 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                                 fVar43 * fVar43 * -0.5 +
                                 ((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) *
                                   fVar31 + (fVar43 * -0.12420141 + 0.14249323) * fVar43 +
                                            -0.16668057) * fVar31 +
                                 (fVar43 * 0.20000714 + -0.24999994) * fVar43 + 0.3333333) * fVar31
                                 + fVar43) & -(uint)(fVar35 != INFINITY)) & -(uint)(fVar35 != 0.0));
        pfVar1[3] = (float)(~-(uint)(fVar36 != 0.0) & 0xff800000 |
                           (~-(uint)(fVar36 != INFINITY) & 0x7f800000 | -(uint)(fVar36 < 0.0) |
                           (uint)(((float)(uVar28 & (uint)((float)uVar27 +
                                                          (float)(uVar16 & 0xc2fc0000 |
                                                                 ~uVar16 & 0xc3160000))) -
                                  (float)(-(uint)(fVar44 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                                 fVar45 * fVar45 * -0.5 +
                                 ((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) *
                                   fVar32 + (fVar45 * -0.12420141 + 0.14249323) * fVar45 +
                                            -0.16668057) * fVar32 +
                                 (fVar45 * 0.20000714 + -0.24999994) * fVar45 + 0.3333333) * fVar32
                                 + fVar45) & -(uint)(fVar36 != INFINITY)) & -(uint)(fVar36 != 0.0));
        uVar12 = uVar12 + 4;
      } while ((long)uVar12 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar10) {
      do {
        fVar17 = logf(pfVar4[uVar13]);
        pfVar3[uVar13] = fVar17;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    return;
  }
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>]"
               );
}

Assistant:

void Exp::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Exp not yet implemented for CUDA");
#else
  fx.vec() = xs[0]->vec().array().exp();
#endif
}